

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

int __thiscall
testing::internal::FunctionMocker<int_()>::InvokeWith
          (FunctionMocker<int_()> *this,ArgumentTuple *args)

{
  ExpectationBase *pEVar1;
  ArgumentTuple *pAVar2;
  size_type sVar3;
  void *mock_obj;
  char *pcVar4;
  ostream *poVar5;
  ostream *local_828;
  ostream *local_818;
  bool local_7d9;
  ostream *local_7c8;
  ostream *local_7b8;
  ostream *local_798;
  bool local_76a;
  bool local_769;
  string local_760;
  undefined1 local_740 [8];
  FailureCleanupHandler handle_failures;
  string local_710;
  bool local_6ea;
  byte local_6e9;
  bool need_to_report_call;
  ExpectationBase *pEStack_6e8;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6c8 [376];
  stringstream local_550 [8];
  stringstream why;
  ostream aoStack_540 [376];
  stringstream local_3c8 [8];
  stringstream ss;
  ostream local_3b8 [383];
  bool local_239;
  undefined1 local_238 [7];
  bool is_excessive;
  undefined1 local_218 [8];
  UninterestingCallCleanupHandler report_uninteresting_call;
  stringstream ss_1;
  ostream local_1f8 [399];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  bool local_25;
  CallReaction local_24;
  bool need_to_report_uninteresting_call;
  ArgumentTuple *pAStack_20;
  CallReaction reaction;
  ArgumentTuple *args_local;
  FunctionMocker<int_()> *this_local;
  
  pAStack_20 = args;
  args_local = (ArgumentTuple *)this;
  sVar3 = std::
          vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&(this->super_UntypedFunctionMockerBase).untyped_expectations_);
  if (sVar3 == 0) {
    mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
    local_24 = Mock::GetReactionOnUninterestingCalls(mock_obj);
    if (local_24 == kAllow) {
      local_769 = LogIsVisible(kInfo);
    }
    else {
      if (local_24 == kWarn) {
        local_76a = LogIsVisible(kWarning);
      }
      else {
        local_76a = true;
      }
      local_769 = local_76a;
    }
    pAVar2 = pAStack_20;
    local_25 = local_769;
    if (local_769 == false) {
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar4,&local_69);
      std::operator+(&local_48,"Function call: ",&local_68);
      this_local._4_4_ = PerformDefaultAction(this,pAVar2,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator(&local_69);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&report_uninteresting_call.ss);
      local_798 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x208) {
        local_798 = local_1f8;
      }
      UntypedDescribeUninterestingCall(this,pAStack_20,local_798);
      pAVar2 = pAStack_20;
      local_218._0_4_ = local_24;
      report_uninteresting_call._0_8_ = &report_uninteresting_call.ss;
      std::__cxx11::stringstream::str();
      this_local._4_4_ =
           PerformActionAndPrintResult<int,_0>
                     (this,(void *)0x0,pAVar2,(string *)local_238,local_1f8);
      std::__cxx11::string::~string((string *)local_238);
      UntypedFunctionMockerBase::UninterestingCallCleanupHandler::~UninterestingCallCleanupHandler
                ((UninterestingCallCleanupHandler *)local_218);
      std::__cxx11::stringstream::~stringstream((stringstream *)&report_uninteresting_call.ss);
    }
  }
  else {
    local_239 = false;
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::__cxx11::stringstream::stringstream(local_550);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_7b8 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3c8) {
      local_7b8 = local_3b8;
    }
    local_7c8 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x550) {
      local_7c8 = aoStack_540;
    }
    pEStack_6e8 = UntypedFindMatchingExpectation
                            (this,pAStack_20,&untyped_expectation,&local_239,local_7b8,local_7c8);
    local_6e9 = pEStack_6e8 != (ExpectationBase *)0x0;
    local_7d9 = true;
    if (((bool)local_6e9) && (local_7d9 = true, (local_239 & 1U) == 0)) {
      local_7d9 = LogIsVisible(kInfo);
    }
    pAVar2 = pAStack_20;
    pEVar1 = untyped_expectation;
    local_6ea = local_7d9;
    if (local_7d9 == false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_710,"",(allocator<char> *)&handle_failures.field_0x27);
      this_local._4_4_ = PerformAction(this,pEVar1,pAVar2,&local_710);
      std::__cxx11::string::~string((string *)&local_710);
      std::allocator<char>::~allocator((allocator<char> *)&handle_failures.field_0x27);
      handle_failures.found = true;
      handle_failures.is_excessive = false;
      handle_failures._34_2_ = 0;
    }
    else {
      poVar5 = std::operator<<(local_3b8,"    Function call: ");
      pcVar4 = UntypedFunctionMockerBase::Name(&this->super_UntypedFunctionMockerBase);
      std::operator<<(poVar5,pcVar4);
      local_818 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3c8) {
        local_818 = local_3b8;
      }
      UntypedPrintArgs(this,pAStack_20,local_818);
      if (((local_6e9 & 1) != 0) && ((local_239 & 1U) == 0)) {
        local_828 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6d8) {
          local_828 = aoStack_6c8;
        }
        ExpectationBase::DescribeLocationTo(pEStack_6e8,local_828);
      }
      pAVar2 = pAStack_20;
      pEVar1 = untyped_expectation;
      local_740 = (undefined1  [8])local_3c8;
      handle_failures.ss = (stringstream *)local_550;
      handle_failures.why = (stringstream *)&untyped_action;
      handle_failures.loc = (stringstream *)pEStack_6e8;
      handle_failures.untyped_expectation._0_1_ = local_6e9 & 1;
      handle_failures.untyped_expectation._1_1_ = local_239 & 1;
      std::__cxx11::stringstream::str();
      this_local._4_4_ =
           PerformActionAndPrintResult<int,_0>(this,pEVar1,pAVar2,&local_760,local_3b8);
      std::__cxx11::string::~string((string *)&local_760);
      handle_failures.found = true;
      handle_failures.is_excessive = false;
      handle_failures._34_2_ = 0;
      UntypedFunctionMockerBase::FailureCleanupHandler::~FailureCleanupHandler
                ((FailureCleanupHandler *)local_740);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_550);
    std::__cxx11::stringstream::~stringstream(local_3c8);
  }
  return this_local._4_4_;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True if and only if we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
            ? LogIsVisible(kWarning)
            :
            // Otherwise, the user wants this to be an error, and we
            // should always print detailed information in the error.
            true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->PerformDefaultAction(
          std::move(args), "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(&args, &ss);

    // Perform the action, print the result, and then report the uninteresting
    // call.
    //
    // We use RAII to do the latter in case R is void or a non-moveable type. In
    // either case we can't assign it to a local variable.
    //
    // Note that std::bind() is essential here.
    // We *don't* use any local callback types (like lambdas).
    // Doing so slows down compilation dramatically because the *constructor* of
    // std::function<T> is re-instantiated with different template
    // parameters each time.
    const UninterestingCallCleanupHandler report_uninteresting_call = {reaction,
                                                                       ss};

    return PerformActionAndPrintResult(nullptr, std::move(args), ss.str(), ss);
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = nullptr;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.

  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(&args, &untyped_action,
                                           &is_excessive, &ss, &why);
  const bool found = untyped_expectation != nullptr;

  // True if and only if we need to print the call's arguments
  // and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return PerformAction(untyped_action, std::move(args), "");
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(&args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  // Perform the action, print the result, and then fail or log in whatever way
  // is appropriate.
  //
  // We use RAII to do the latter in case R is void or a non-moveable type. In
  // either case we can't assign it to a local variable.
  //
  // Note that we *don't* use any local callback types (like lambdas) here.
  // Doing so slows down compilation dramatically because the *constructor* of
  // std::function<T> is re-instantiated with different template
  // parameters each time.
  const FailureCleanupHandler handle_failures = {
      ss, why, loc, untyped_expectation, found, is_excessive};

  return PerformActionAndPrintResult(untyped_action, std::move(args), ss.str(),
                                     ss);
}